

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_GIF.cpp
# Opt level: O0

int __thiscall Am_GIF_Image::load_gif_colormap(Am_GIF_Image *this,ifstream *ifs,int flags)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  Am_RGB_Value *pAVar4;
  Am_RGB_Value *local_68;
  byte local_3b;
  byte local_3a;
  byte local_39;
  int local_38;
  uchar buf [3];
  int i;
  int flags_local;
  ifstream *ifs_local;
  Am_GIF_Image *this_local;
  
  (this->super_Am_Generic_Image).iminfo.num_colors = 1 << ((byte)flags & 7) + 1;
  if (((this->super_Am_Generic_Image).color_map != (Am_RGB_Value *)0x0) &&
     (pAVar4 = (this->super_Am_Generic_Image).color_map, pAVar4 != (Am_RGB_Value *)0x0)) {
    operator_delete__(pAVar4);
  }
  uVar2 = (ulong)(this->super_Am_Generic_Image).iminfo.num_colors;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(6),0);
  if (SUB168(auVar1 * ZEXT816(6),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pAVar4 = (Am_RGB_Value *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_68 = pAVar4;
    do {
      Am_RGB_Value::Am_RGB_Value(local_68);
      local_68 = local_68 + 1;
    } while (local_68 != pAVar4 + uVar2);
  }
  (this->super_Am_Generic_Image).color_map = pAVar4;
  if ((this->super_Am_Generic_Image).color_map == (Am_RGB_Value *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    for (local_38 = 0; local_38 < (this->super_Am_Generic_Image).iminfo.num_colors;
        local_38 = local_38 + 1) {
      std::istream::read((char *)ifs,(long)&local_3b);
      (this->super_Am_Generic_Image).color_map[local_38].red = (ushort)local_3b;
      (this->super_Am_Generic_Image).color_map[local_38].green = (ushort)local_3a;
      (this->super_Am_Generic_Image).color_map[local_38].blue = (ushort)local_39;
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int
Am_GIF_Image::load_gif_colormap(std::ifstream &ifs, int flags)
{
  //  iminfo.depth = CTSIZE(flags) + 1; set in caller
  //  iminfo.num_colors = 1 << iminfo.depth;
  iminfo.num_colors = 1 << (CTSIZE(flags) + 1);
  // if we have a color map, delete it before reallocating
  if (color_map != nullptr)
    delete[] color_map;
  color_map = new Am_RGB_Value[iminfo.num_colors];
  if (color_map == nullptr)
    return 0; // failure
  int i;
  unsigned char buf[3];
  for (i = 0; i < iminfo.num_colors; i++) {
    // ifs.read(buf, 3);  MSL
    ifs.read((char *)buf, 3);
    color_map[i].red = buf[0];
    color_map[i].green = buf[1];
    color_map[i].blue = buf[2];
  }
  return 1;
}